

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NavApplyItemToResult(ImGuiNavItemData *result)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  uint uVar4;
  ImGuiWindow *pIVar5;
  ImGuiContext *pIVar6;
  float fVar7;
  float fVar8;
  
  pIVar6 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  result->Window = pIVar5;
  result->ID = (pIVar6->LastItemData).ID;
  result->FocusScopeId = pIVar6->CurrentFocusScopeId;
  uVar4 = (pIVar6->LastItemData).InFlags;
  result->InFlags = uVar4;
  IVar1 = (pIVar5->DC).CursorStartPos;
  IVar2 = (pIVar6->LastItemData).NavRect.Min;
  IVar3 = (pIVar6->LastItemData).NavRect.Max;
  fVar7 = IVar1.x;
  fVar8 = IVar1.y;
  (result->RectRel).Min.x = IVar2.x - fVar7;
  (result->RectRel).Min.y = IVar2.y - fVar8;
  (result->RectRel).Max.x = IVar3.x - fVar7;
  (result->RectRel).Max.y = IVar3.y - fVar8;
  if ((uVar4 >> 0x15 & 1) != 0) {
    result->SelectionUserData = (pIVar6->NextItemData).SelectionUserData;
  }
  return;
}

Assistant:

static void ImGui::NavApplyItemToResult(ImGuiNavItemData* result)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    result->Window = window;
    result->ID = g.LastItemData.ID;
    result->FocusScopeId = g.CurrentFocusScopeId;
    result->InFlags = g.LastItemData.InFlags;
    result->RectRel = WindowRectAbsToRel(window, g.LastItemData.NavRect);
    if (result->InFlags & ImGuiItemFlags_HasSelectionUserData)
    {
        IM_ASSERT(g.NextItemData.SelectionUserData != ImGuiSelectionUserData_Invalid);
        result->SelectionUserData = g.NextItemData.SelectionUserData; // INTENTIONAL: At this point this field is not cleared in NextItemData. Avoid unnecessary copy to LastItemData.
    }
}